

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O2

bool __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::EvalQuantifier
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          Stack<rapidjson::CrtAllocator> *operandStack,uint n,uint m)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint i;
  bool bVar7;
  undefined8 uStack_40;
  undefined1 auStack_38 [8];
  
  if (m < n) {
    uStack_40 = 0x144de3;
    __assert_fail("n <= m",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                  ,0x19c,
                  "bool rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::EvalQuantifier(Stack<Allocator> &, unsigned int, unsigned int) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  if (0xb < (ulong)((long)operandStack->stackTop_ - (long)operandStack->stack_)) {
    if (n == 0) {
      if (m == 0) {
        return false;
      }
      if (m == 0xffffffff) {
        uStack_40 = 0x144d5a;
        Eval(this,operandStack,kZeroOrMore);
      }
      else {
        uStack_40 = 0x144d93;
        Eval(this,operandStack,kZeroOrOne);
        iVar6 = m - 1;
        iVar4 = iVar6;
        while (bVar7 = iVar4 != 0, iVar4 = iVar4 + -1, bVar7) {
          uStack_40 = 0x144da9;
          CloneTopOperand(this,operandStack);
        }
        while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
          uStack_40 = 0x144dc2;
          Eval(this,operandStack,kConcatenation);
        }
      }
    }
    else {
      iVar4 = n - 1;
      uStack_40 = 1;
      for (uVar5 = 1; n != uVar5; uVar5 = uVar5 + 1) {
        uStack_40 = 0x144cfe;
        CloneTopOperand(this,operandStack);
      }
      if (m == 0xffffffff) {
        puVar2 = &uStack_40;
        uStack_40 = 2;
        goto LAB_00144e13;
      }
      iVar6 = m - n;
      puVar3 = (undefined8 *)auStack_38;
      if (n <= m && iVar6 != 0) {
        uStack_40 = 0x144d1f;
        CloneTopOperand(this,operandStack);
        uStack_40 = 0x144d2c;
        Eval(this,operandStack,kZeroOrOne);
        for (; n < m - 1; n = n + 1) {
          uStack_40 = 0x144d3e;
          CloneTopOperand(this,operandStack);
        }
        uStack_40 = 3;
        while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, puVar3 = (undefined8 *)auStack_38, bVar7) {
          uStack_40 = 0x144d80;
          Eval(this,operandStack,kConcatenation);
        }
      }
      while (bVar7 = iVar4 != 0, iVar4 = iVar4 + -1, bVar7) {
        puVar2 = (undefined8 *)((long)puVar3 + -8);
        *(undefined8 *)((long)puVar3 + -8) = 3;
LAB_00144e13:
        uVar1 = *puVar2;
        puVar3 = puVar2 + 1;
        *puVar2 = 0x144e1f;
        Eval(this,operandStack,(Operator)uVar1);
      }
    }
    return true;
  }
  uStack_40 = 0x144e02;
  __assert_fail("operandStack.GetSize() >= sizeof(Frag)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                ,0x19d,
                "bool rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::EvalQuantifier(Stack<Allocator> &, unsigned int, unsigned int) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

bool EvalQuantifier(Stack<Allocator>& operandStack, unsigned n, unsigned m) {
        RAPIDJSON_ASSERT(n <= m);
        RAPIDJSON_ASSERT(operandStack.GetSize() >= sizeof(Frag));

        if (n == 0) {
            if (m == 0)                             // a{0} not support
                return false;
            else if (m == kInfinityQuantifier)
                Eval(operandStack, kZeroOrMore);    // a{0,} -> a*
            else {
                Eval(operandStack, kZeroOrOne);         // a{0,5} -> a?
                for (unsigned i = 0; i < m - 1; i++)
                    CloneTopOperand(operandStack);      // a{0,5} -> a? a? a? a? a?
                for (unsigned i = 0; i < m - 1; i++)
                    Eval(operandStack, kConcatenation); // a{0,5} -> a?a?a?a?a?
            }
            return true;
        }

        for (unsigned i = 0; i < n - 1; i++)        // a{3} -> a a a
            CloneTopOperand(operandStack);

        if (m == kInfinityQuantifier)
            Eval(operandStack, kOneOrMore);         // a{3,} -> a a a+
        else if (m > n) {
            CloneTopOperand(operandStack);          // a{3,5} -> a a a a
            Eval(operandStack, kZeroOrOne);         // a{3,5} -> a a a a?
            for (unsigned i = n; i < m - 1; i++)
                CloneTopOperand(operandStack);      // a{3,5} -> a a a a? a?
            for (unsigned i = n; i < m; i++)
                Eval(operandStack, kConcatenation); // a{3,5} -> a a aa?a?
        }

        for (unsigned i = 0; i < n - 1; i++)
            Eval(operandStack, kConcatenation);     // a{3} -> aaa, a{3,} -> aaa+, a{3.5} -> aaaa?a?

        return true;
    }